

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

void __thiscall draco::ObjEncoder::EncodeInt(ObjEncoder *this,int32_t val)

{
  uint in_ESI;
  ObjEncoder *in_RDI;
  void *unaff_retaddr;
  EncoderBuffer *in_stack_00000008;
  ObjEncoder *data_size;
  
  data_size = in_RDI;
  snprintf(in_RDI->num_buffer_,0x14,"%d",(ulong)in_ESI);
  buffer(in_RDI);
  strlen(in_RDI->num_buffer_);
  EncoderBuffer::Encode(in_stack_00000008,unaff_retaddr,(size_t)data_size);
  return;
}

Assistant:

void ObjEncoder::EncodeInt(int32_t val) {
  snprintf(num_buffer_, sizeof(num_buffer_), "%d", val);
  buffer()->Encode(num_buffer_, strlen(num_buffer_));
}